

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Emulator emu;
  
  if (argc == 2) {
    printf("Loading %s\n",argv[1]);
    Emulator::Emulator(&emu,argv[1]);
    Emulator::run(&emu,3000);
    puts("DONE");
    Emulator::~Emulator(&emu);
    return 0;
  }
  fprintf(_stderr,"Usage: %s romfile\n",*argv);
  exit(1);
}

Assistant:

int main(int argc, char** argv){
	if (argc != 2){
		fprintf(stderr, "Usage: %s romfile\n", argv[0]);
		exit(EXIT_FAILURE);
	}
	
	printf("Loading %s\n", argv[1]);

	Emulator emu(argv[1]);
	emu.run(3000); // This can be changed for faster or slower game
	printf("DONE\n");
}